

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O1

void __thiscall absl::flags_internal::FlagImpl::Init(FlagImpl *this)

{
  byte bVar1;
  __int_type in_RAX;
  void *pvVar2;
  atomic<unsigned_long> *paVar3;
  atomic<long> *paVar4;
  uint uVar5;
  FlagDfltGenFunc p_Var6;
  array<char,_8UL> buf;
  __atomic_base<long> local_18;
  
  this->data_guard_[0] = '\0';
  this->data_guard_[1] = '\0';
  this->data_guard_[2] = '\0';
  this->data_guard_[3] = '\0';
  this->data_guard_[4] = '\0';
  this->data_guard_[5] = '\0';
  this->data_guard_[6] = '\0';
  this->data_guard_[7] = '\0';
  bVar1 = this->field_0x29 & 3;
  uVar5 = *(uint *)&this->field_0x28 >> 1 & 3;
  if (uVar5 < 2) {
    local_18._M_i = 0;
    if (bVar1 == 1) {
      (*(this->default_value_).gen_func)(&local_18);
    }
    else {
      if ((this->field_0x29 & 3) == 0) {
        __assert_fail("def_kind != FlagDefaultKind::kDynamicValue",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/flags/internal/flag.cc"
                      ,0x9b,"void absl::flags_internal::FlagImpl::Init()");
      }
      pvVar2 = (*this->op_)(kSizeof,(void *)0x0,(void *)0x0,(void *)0x0);
      memcpy(&local_18,&this->default_value_,(size_t)pvVar2);
    }
    if ((this->field_0x28 & 6) == 0) {
      pvVar2 = (*this->op_)(kSizeof,(void *)0x0,(void *)0x0,(void *)0x0);
      *(undefined1 *)((long)&local_18._M_i + (long)pvVar2) = 1;
    }
    paVar4 = OneWordValue(this);
    (paVar4->super___atomic_base<long>)._M_i = local_18._M_i;
  }
  else {
    local_18._M_i = in_RAX;
    if (uVar5 == 2) {
      if (bVar1 != 1) {
        __assert_fail("def_kind == FlagDefaultKind::kGenFunc",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/flags/internal/flag.cc"
                      ,0xad,"void absl::flags_internal::FlagImpl::Init()");
      }
      p_Var6 = (this->default_value_).gen_func;
      paVar3 = AtomicBufferValue(this);
    }
    else {
      if (bVar1 != 1) {
        __assert_fail("def_kind == FlagDefaultKind::kGenFunc",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/flags/internal/flag.cc"
                      ,0xb4,"void absl::flags_internal::FlagImpl::Init()");
      }
      p_Var6 = (this->default_value_).gen_func;
      paVar3 = (atomic<unsigned_long> *)AlignedBufferValue(this);
    }
    (*p_Var6)(paVar3);
  }
  if ((this->seq_lock_).lock_.super___atomic_base<long>._M_i == -1) {
    (this->seq_lock_).lock_.super___atomic_base<long>._M_i = 0;
    return;
  }
  __assert_fail("lock_.load(std::memory_order_relaxed) == kUninitialized",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/flags/internal/sequence_lock.h"
                ,0x40,"void absl::flags_internal::SequenceLock::MarkInitialized()");
}

Assistant:

void FlagImpl::Init() {
  new (&data_guard_) absl::Mutex;

  auto def_kind = static_cast<FlagDefaultKind>(def_kind_);

  switch (ValueStorageKind()) {
    case FlagValueStorageKind::kValueAndInitBit:
    case FlagValueStorageKind::kOneWordAtomic: {
      alignas(int64_t) std::array<char, sizeof(int64_t)> buf{};
      if (def_kind == FlagDefaultKind::kGenFunc) {
        (*default_value_.gen_func)(buf.data());
      } else {
        assert(def_kind != FlagDefaultKind::kDynamicValue);
        std::memcpy(buf.data(), &default_value_, Sizeof(op_));
      }
      if (ValueStorageKind() == FlagValueStorageKind::kValueAndInitBit) {
        // We presume here the memory layout of FlagValueAndInitBit struct.
        uint8_t initialized = 1;
        std::memcpy(buf.data() + Sizeof(op_), &initialized,
                    sizeof(initialized));
      }
      // Type can contain valid uninitialized bits, e.g. padding.
      ABSL_ANNOTATE_MEMORY_IS_INITIALIZED(buf.data(), buf.size());
      OneWordValue().store(absl::bit_cast<int64_t>(buf),
                           std::memory_order_release);
      break;
    }
    case FlagValueStorageKind::kSequenceLocked: {
      // For this storage kind the default_value_ always points to gen_func
      // during initialization.
      assert(def_kind == FlagDefaultKind::kGenFunc);
      (*default_value_.gen_func)(AtomicBufferValue());
      break;
    }
    case FlagValueStorageKind::kAlignedBuffer:
      // For this storage kind the default_value_ always points to gen_func
      // during initialization.
      assert(def_kind == FlagDefaultKind::kGenFunc);
      (*default_value_.gen_func)(AlignedBufferValue());
      break;
  }
  seq_lock_.MarkInitialized();
}